

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_reference_base(Hasher *h,VkAttachmentReference2 *ref)

{
  bool bVar1;
  VkAttachmentReference2 *ref_local;
  Hasher *h_local;
  
  Hasher::u32(h,ref->attachment);
  Hasher::u32(h,ref->layout);
  Hasher::u32(h,ref->aspectMask);
  bVar1 = hash_pnext_chain((StateRecorder *)0x0,h,ref->pNext,(DynamicStateInfo *)0x0,0);
  return bVar1;
}

Assistant:

static bool hash_reference_base(Hasher &h, const VkAttachmentReference2 &ref)
{
	h.u32(ref.attachment);
	h.u32(ref.layout);
	h.u32(ref.aspectMask);
	return hash_pnext_chain(nullptr, h, ref.pNext, nullptr, 0);
}